

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  ImDrawList *this_00;
  
  this_00 = (ImDrawList *)ImGui::MemAlloc(0xa8);
  ImDrawList(this_00,this->_Data);
  ImVector<ImDrawCmd>::operator=((ImVector<ImDrawCmd> *)this_00,&this->CmdBuffer);
  ImVector<unsigned_int>::operator=(&this_00->IdxBuffer,&this->IdxBuffer);
  ImVector<ImDrawVert>::operator=(&this_00->VtxBuffer,&this->VtxBuffer);
  this_00->Flags = this->Flags;
  return this_00;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}